

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O0

void joypad_playback_callback(JoypadButtons *joyp,void *user_data)

{
  bool bVar1;
  Ticks TVar2;
  Ticks TVar3;
  void *pvVar4;
  JoypadButtons local_80;
  JoypadStateIter local_60;
  JoypadStateIter local_50;
  JoypadStateIter local_40;
  Ticks local_30;
  Ticks ticks;
  JoypadPlayback *playback;
  void *pvStack_18;
  Bool changed;
  void *user_data_local;
  JoypadButtons *joyp_local;
  
  playback._4_4_ = 0;
  ticks = (Ticks)user_data;
  pvStack_18 = user_data;
  user_data_local = joyp;
  local_30 = emulator_get_ticks(*user_data);
  TVar2 = ticks;
  if (local_30 < **(ulong **)(ticks + 0x18)) {
    local_40 = joypad_find_state(*(JoypadBuffer **)(ticks + 8),local_30);
    TVar3 = ticks;
    *(JoypadChunk **)(TVar2 + 0x10) = local_40.chunk;
    *(JoypadState **)(TVar2 + 0x18) = local_40.state;
    local_50 = joypad_get_next_state(*(JoypadStateIter *)(ticks + 0x10));
    *(JoypadChunk **)(TVar3 + 0x20) = local_50.chunk;
    *(JoypadState **)(TVar3 + 0x28) = local_50.state;
    playback._4_4_ = 1;
  }
  if (local_30 < **(ulong **)(ticks + 0x18)) {
    __assert_fail("ticks >= playback->current.state->ticks",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",
                  0x10f,"void joypad_playback_callback(struct JoypadButtons *, void *)");
  }
  while( true ) {
    pvVar4 = user_data_local;
    TVar2 = ticks;
    bVar1 = false;
    if (*(long *)(ticks + 0x28) != 0) {
      bVar1 = **(ulong **)(ticks + 0x28) <= local_30;
    }
    if (!bVar1) break;
    if (**(ulong **)(ticks + 0x28) < **(ulong **)(ticks + 0x18)) {
      __assert_fail("playback->next.state->ticks >= playback->current.state->ticks",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",
                    0x112,"void joypad_playback_callback(struct JoypadButtons *, void *)");
    }
    *(undefined8 *)(ticks + 0x10) = *(undefined8 *)(ticks + 0x20);
    *(undefined8 *)(ticks + 0x18) = *(undefined8 *)(ticks + 0x28);
    local_60 = joypad_get_next_state(*(JoypadStateIter *)(ticks + 0x20));
    *(JoypadChunk **)(TVar2 + 0x20) = local_60.chunk;
    *(JoypadState **)(TVar2 + 0x28) = local_60.state;
    playback._4_4_ = 1;
  }
  joypad_unpack_buttons(&local_80,*(u8 *)(*(long *)(ticks + 0x18) + 8));
  *(undefined8 *)pvVar4 = local_80._0_8_;
  *(undefined8 *)((long)pvVar4 + 8) = local_80._8_8_;
  *(undefined8 *)((long)pvVar4 + 0x10) = local_80._16_8_;
  *(undefined8 *)((long)pvVar4 + 0x18) = local_80._24_8_;
  return;
}

Assistant:

static void joypad_playback_callback(struct JoypadButtons* joyp,
                                     void* user_data) {
  Bool changed = FALSE;
  JoypadPlayback* playback = user_data;
  Ticks ticks = emulator_get_ticks(playback->e);
  if (ticks < playback->current.state->ticks) {
    playback->current = joypad_find_state(playback->buffer, ticks);
    playback->next = joypad_get_next_state(playback->current);
    changed = TRUE;
  }

  assert(ticks >= playback->current.state->ticks);

  while (playback->next.state && playback->next.state->ticks <= ticks) {
    assert(playback->next.state->ticks >= playback->current.state->ticks);
    playback->current = playback->next;
    playback->next = joypad_get_next_state(playback->next);
    changed = TRUE;
  }

#if DEBUG_JOYPAD_BUTTONS
  if (changed) {
    print_joypad_buttons(
        playback->current.state->ticks,
        joypad_unpack_buttons(playback->current.state->buttons));
  }
#else
  (void)changed;
#endif

  *joyp = joypad_unpack_buttons(playback->current.state->buttons);
}